

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filteredbrk.cpp
# Opt level: O2

FilteredBreakIteratorBuilder *
icu_63::FilteredBreakIteratorBuilder::createInstance(Locale *where,UErrorCode *status)

{
  UErrorCode UVar1;
  SimpleFilteredBreakIteratorBuilder *this;
  SimpleFilteredBreakIteratorBuilder *pSVar2;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    this = (SimpleFilteredBreakIteratorBuilder *)
           UMemory::operator_new((UMemory *)0x30,(size_t)status);
    if (this != (SimpleFilteredBreakIteratorBuilder *)0x0) {
      SimpleFilteredBreakIteratorBuilder::SimpleFilteredBreakIteratorBuilder(this,where,status);
    }
    UVar1 = *status;
    if (UVar1 < U_ILLEGAL_ARGUMENT_ERROR && this == (SimpleFilteredBreakIteratorBuilder *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      pSVar2 = (SimpleFilteredBreakIteratorBuilder *)0x0;
      if (UVar1 < U_ILLEGAL_ARGUMENT_ERROR) {
        pSVar2 = this;
      }
      if (UVar1 < U_ILLEGAL_ARGUMENT_ERROR || this == (SimpleFilteredBreakIteratorBuilder *)0x0) {
        return &pSVar2->super_FilteredBreakIteratorBuilder;
      }
      (*(this->super_FilteredBreakIteratorBuilder).super_UObject._vptr_UObject[1])(this);
    }
  }
  return (FilteredBreakIteratorBuilder *)0x0;
}

Assistant:

FilteredBreakIteratorBuilder *
FilteredBreakIteratorBuilder::createInstance(const Locale& where, UErrorCode& status) {
  if(U_FAILURE(status)) return NULL;
  LocalPointer<FilteredBreakIteratorBuilder> ret(new SimpleFilteredBreakIteratorBuilder(where, status), status);
  return (U_SUCCESS(status))? ret.orphan(): NULL;
}